

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void verify_staleblock_reuse_param_test(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  fdb_status extraout_EAX;
  int extraout_EDX;
  byte bVar3;
  undefined4 *puVar4;
  fdb_file_info *pfVar5;
  char *__format;
  fdb_kvs_handle *__s;
  ulong uVar6;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  char keybuf [512];
  char bodybuf [512];
  fdb_file_handle *local_5b0;
  fdb_kvs_handle *local_5a8;
  fdb_kvs_config local_5a0;
  timeval local_588;
  fdb_config local_578;
  fdb_file_info local_480;
  undefined4 local_438 [128];
  char local_238 [520];
  
  gettimeofday(&local_588,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_578.compaction_threshold = '\0';
  local_578.block_reusing_threshold = 0x41;
  do {
    system("rm -rf  staleblktest* > errorlog.txt");
    fdb_open(&local_5b0,"./staleblktest1",&local_578);
    fdb_kvs_open_default(local_5b0,&local_5a8,&local_5a0);
    if (local_578.num_keeping_headers != 0xffffffffffffffff) {
      uVar6 = 0;
      do {
        local_438[0] = 0x79656b;
        puVar4 = local_438;
        fVar1 = fdb_set_kv(local_5a8,local_438,0x200,(void *)0x0,0);
        bVar3 = (byte)puVar4;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010b52f;
        bVar3 = 1;
        fVar1 = fdb_commit(local_5b0,'\x01');
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010b536;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_578.num_keeping_headers + 1);
    }
    uVar6 = 0;
    do {
      local_438[0] = 0x79656b;
      sprintf(local_238,"body%d",uVar6);
      puVar4 = local_438;
      fVar1 = fdb_set_kv(local_5a8,local_438,0x200,local_238,0x200);
      bVar3 = (byte)puVar4;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010b528:
        verify_staleblock_reuse_param_test();
LAB_0010b52f:
        verify_staleblock_reuse_param_test();
LAB_0010b536:
        verify_staleblock_reuse_param_test();
        fVar1 = extraout_EAX;
        goto LAB_0010b53d;
      }
      pfVar5 = &local_480;
      fVar1 = fdb_get_file_info(local_5b0,&local_480);
      bVar3 = (byte)pfVar5;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        verify_staleblock_reuse_param_test();
        goto LAB_0010b528;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (local_480.file_size < 0x1000000);
    __s = local_5a8;
    sVar2 = sb_check_block_reusing(local_5a8);
    if (local_578.block_reusing_threshold == 0x41) {
      if (sVar2 == SBD_RECLAIM) goto LAB_0010b499;
LAB_0010b544:
      verify_staleblock_reuse_param_test();
LAB_0010b549:
      verify_staleblock_reuse_param_test();
      if (extraout_EDX < 2) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)(extraout_EDX - 1);
        memset(__s,(uint)bVar3,uVar6);
      }
      (&(__s->kvs_config).create_if_missing)[uVar6] = false;
      return;
    }
    if (sVar2 != SBD_NONE) goto LAB_0010b549;
LAB_0010b499:
    fVar1 = fdb_close(local_5b0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010b53d:
      __s = (fdb_kvs_handle *)(ulong)(uint)fVar1;
      verify_staleblock_reuse_param_test();
      goto LAB_0010b544;
    }
    fdb_shutdown();
    if (local_578.block_reusing_threshold == 0) {
      local_578.block_reusing_threshold = 100;
    }
    else {
      if (local_578.block_reusing_threshold != 0x41) {
        memleak_end();
        __format = "%s PASSED\n";
        if (verify_staleblock_reuse_param_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"verify staleblock reuse param test");
        return;
      }
      local_578.block_reusing_threshold = 0;
    }
  } while( true );
}

Assistant:

void verify_staleblock_reuse_param_test() {
    TEST_INIT();
    memleak_start();

    uint64_t i;
    int r;
    const int kv = 512;
    char keybuf[kv];
    char bodybuf[kv];
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    // set block reuse threshold = 65
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;

start_data_loading:
    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create num_keeping_headers+1
    for (i = 0; i < fconfig.num_keeping_headers + 1; i++) {
        sprintf(keybuf, "key");
        status = fdb_set_kv(db, keybuf, kv, NULL, 0);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "key");
        sprintf(bodybuf, "body%d", static_cast<int>(i));
        status = fdb_set_kv(db, keybuf, kv, bodybuf, kv);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);

    // expect block reclaim only for valid threshold value
    sb_decision = sb_check_block_reusing(db);
    if (fconfig.block_reusing_threshold == 65) {
        TEST_CHK(sb_decision == SBD_RECLAIM);
    } else {
        TEST_CHK(sb_decision == SBD_NONE);
    }

    // intermediate cleanup
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    // run again with different config
    if (fconfig.block_reusing_threshold == 65) {
        // disable with 0
        fconfig.block_reusing_threshold = 0;
        goto start_data_loading;
    } else if (fconfig.block_reusing_threshold == 0) {
        // disable with 100
        fconfig.block_reusing_threshold = 100;
        goto start_data_loading;
    }

    memleak_end();
    TEST_RESULT("verify staleblock reuse param test");
}